

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskController.cpp
# Opt level: O2

void __thiscall Storage::Disk::Controller::set_drive(Controller *this,int index_mask)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Drive *this_00;
  
  if (this->drive_selection_mask_ != index_mask) {
    iVar1 = (**(this->super_Source)._vptr_Source)();
    Drive::set_event_delegate(this->drive_,(EventDelegate *)0x0);
    if (index_mask == 0) {
      this_00 = &this->empty_drive_;
    }
    else {
      lVar3 = 0;
      for (; (index_mask & 1U) == 0; index_mask = index_mask >> 1) {
        lVar3 = lVar3 + 8;
      }
      this_00 = *(Drive **)
                 ((long)&(((this->drives_).
                           super__Vector_base<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Storage::Disk::Drive_*,_std::default_delete<Storage::Disk::Drive>_>
                         .super__Head_base<0UL,_Storage::Disk::Drive_*,_false>._M_head_impl + lVar3)
      ;
    }
    this->drive_ = this_00;
    Drive::set_event_delegate(this_00,&this->super_EventDelegate);
    iVar2 = (**(this->super_Source)._vptr_Source)(this);
    if (iVar2 != iVar1) {
      ClockingHint::Source::update_clocking_observer(&this->super_Source);
      return;
    }
  }
  return;
}

Assistant:

void Controller::set_drive(int index_mask) {
	if(drive_selection_mask_ == index_mask) {
		return;
	}

	const ClockingHint::Preference former_preference = preferred_clocking();

	// Stop receiving events from the current drive.
	get_drive().set_event_delegate(nullptr);

	// TODO: a transfer of writing state, if writing?

	if(!index_mask) {
		drive_ = &empty_drive_;
	} else {
		// TEMPORARY FIX: connect up only the first selected drive.
		// TODO: at least merge events if multiple drives are selected. Some computers have
		// controllers that allow this, with usually meaningless results as far as I can
		// imagine. But the limit of an emulator shouldn't be the author's imagination.
		size_t index = 0;
		while(!(index_mask&1)) {
			index_mask >>= 1;
			++index;
		}
		drive_ = drives_[index].get();
	}

	get_drive().set_event_delegate(this);

	if(preferred_clocking() != former_preference) {
		update_clocking_observer();
	}
}